

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_perform_rcpt_to(connectdata *conn)

{
  CURLcode CVar1;
  char *address;
  hostname host;
  char *local_40;
  hostname local_38;
  
  local_40 = (char *)0x0;
  local_38.name = (char *)0x0;
  local_38.dispname = (char *)0x0;
  local_38.rawalloc = (char *)0x0;
  local_38.encalloc = (char *)0x0;
  CVar1 = smtp_parse_address(conn,(char *)**(undefined8 **)((long)(conn->data->req).protop + 0x10),
                             &local_40,&local_38);
  if (CVar1 == CURLE_OK) {
    if (local_38.name == (char *)0x0) {
      CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"RCPT TO:<%s>",local_40);
    }
    else {
      CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"RCPT TO:<%s@%s>",local_40);
    }
    Curl_free_idnconverted_hostname(&local_38);
    (*Curl_cfree)(local_40);
    if (CVar1 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_FETCH;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_perform_rcpt_to(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  char *address = NULL;
  struct hostname host = { NULL, NULL, NULL, NULL };

  /* Parse the recipient mailbox into the local address and host name parts,
     converting the host name to an IDN A-label if necessary */
  result = smtp_parse_address(conn, smtp->rcpt->data,
                              &address, &host);
  if(result)
    return result;

  /* Send the RCPT TO command */
  if(host.name)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "RCPT TO:<%s@%s>", address,
                           host.name);
  else
    /* An invalid mailbox was provided but we'll simply let the server worry
       about that and reply with a 501 error */
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "RCPT TO:<%s>", address);

  Curl_free_idnconverted_hostname(&host);
  free(address);

  if(!result)
    state(conn, SMTP_RCPT);

  return result;
}